

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_rx_cb(void *arg)

{
  nng_err nVar1;
  void *local_48;
  nni_aio_completions complq;
  nng_sockaddr *sa;
  udp_sp_msg *hdr;
  size_t n;
  nni_aio *pnStack_20;
  int rv;
  nni_aio *aio;
  udp_ep *ep;
  void *arg_local;
  
  pnStack_20 = (nni_aio *)((long)arg + 0x658);
  aio = (nni_aio *)arg;
  ep = (udp_ep *)arg;
  nni_mtx_lock((nni_mtx *)((long)arg + 8));
  n._4_4_ = nni_aio_result(pnStack_20);
  if (n._4_4_ == NNG_OK) {
    if (((ulong)(aio->a_task).task_arg & 0x100000000000000) == 0) {
      sa = (nng_sockaddr *)aio[5].a_inputs[0];
      complq = &aio[2].a_task.task_cv;
      hdr = (udp_sp_msg *)nng_aio_count(pnStack_20);
      if (((udp_sp_msg *)0x13 < hdr) && (*(char *)sa == '\x01')) {
        hdr = hdr + -1;
        switch(*(undefined1 *)((long)&(sa->s_ipc).sa_family + 1)) {
        case 0:
          udp_recv_data((udp_ep *)aio,(udp_sp_data *)&sa->s_ipc,(size_t)hdr,(nng_sockaddr *)complq);
          break;
        case 1:
          udp_recv_creq((udp_ep *)aio,(udp_sp_creq *)&sa->s_ipc,(nng_sockaddr *)complq);
          break;
        case 2:
          udp_recv_cack((udp_ep *)aio,(udp_sp_creq *)&sa->s_ipc,(nng_sockaddr *)complq);
          break;
        case 3:
          udp_recv_disc((udp_ep *)aio,(udp_sp_disc *)&sa->s_ipc,(nng_sockaddr *)complq);
          break;
        case 4:
        default:
          udp_send_disc_full((udp_ep *)aio,(nng_sockaddr *)complq,0,(sa->s_in).sa_addr,0,DISC_PROTO)
          ;
        }
      }
    }
    else {
      *(undefined1 *)((long)&(aio->a_task).task_arg + 7) = 0;
    }
  }
  else {
    nVar1 = nni_aio_result(pnStack_20);
    if ((nVar1 != NNG_EINTR) && (nVar1 != NNG_ETIMEDOUT)) {
      if (nVar1 == NNG_ECLOSED) {
LAB_0014207d:
        nni_mtx_unlock((nni_mtx *)&aio->a_expire);
        return;
      }
      if (nVar1 != NNG_EAGAIN) {
        if ((nVar1 != NNG_ECANCELED) && (nVar1 != NNG_ESTOPPED)) {
          *(undefined1 *)((long)&(aio->a_task).task_arg + 7) = 1;
          nni_sleep_aio(5,pnStack_20);
          nni_mtx_unlock((nni_mtx *)&aio->a_expire);
          return;
        }
        goto LAB_0014207d;
      }
    }
    *(undefined1 *)((long)&(aio->a_task).task_arg + 7) = 0;
  }
  udp_start_rx((udp_ep *)aio);
  local_48 = aio[5].a_outputs[1];
  nni_aio_completions_init(aio[5].a_outputs + 1);
  nni_mtx_unlock((nni_mtx *)&aio->a_expire);
  nni_aio_completions_run(&local_48);
  return;
}

Assistant:

static void
udp_rx_cb(void *arg)
{
	udp_ep             *ep  = arg;
	nni_aio            *aio = &ep->rx_aio;
	int                 rv;
	size_t              n;
	udp_sp_msg         *hdr;
	nng_sockaddr       *sa;
	nni_aio_completions complq;

	// for a received packet we are either receiving it for a
	// connection we already have established, or for a new connection.
	// Dialers cannot receive connection requests (as a safety
	// precaution).

	nni_mtx_lock(&ep->mtx);
	if ((rv = nni_aio_result(aio)) != 0) {
		// something bad happened on RX... which is unexpected.
		// sleep a little bit and hope for recovery.
		switch (nni_aio_result(aio)) {
		case NNG_ECLOSED:
		case NNG_ECANCELED:
		case NNG_ESTOPPED:
			nni_mtx_unlock(&ep->mtx);
			return;
		case NNG_ETIMEDOUT:
		case NNG_EAGAIN:
		case NNG_EINTR:
			ep->cooldown = false;
			goto finish;
			break;
		default:
			ep->cooldown = true;
			nni_sleep_aio(5, aio);
			nni_mtx_unlock(&ep->mtx);
			return;
		}
	}
	if (ep->cooldown) {
		ep->cooldown = false;
		goto finish;
	}

	// Received message will be in the ep rx header.
	hdr = ep->rx_msg;
	sa  = &ep->rx_sa;
	n   = nng_aio_count(aio);

	if ((n >= sizeof(*hdr)) && (hdr->data.us_ver == 1)) {
		n -= sizeof(*hdr);

#ifndef NNG_LITTLE_ENDIAN
		// Fix the endianness, so other routines don't have to.
		// It turns out that the endianness of the fields of CREQ
		// is compatible with the fields of every other message type.
		// We only have to do this for systems that are not known
		// (at compile time) to be little endian.
		hdr->data.us_type      = NNI_GET16LE(&hdr->data.us_type);
		hdr->data.us_sender_id = NNI_GET32LE(&hdr->data.us_sender_id);
		hdr->data.us_peeer_id  = NNI_GET32LE(&hdr->data.us_peer_id);
		hdr->data.us_sequence  = NNI_GET32LE(&hdr->data.us_sequence);
		hdr->data.us_length    = NNI_GET16LE(&hdr->data.us_length);
#endif

		switch (hdr->data.us_op_code) {
		case OPCODE_DATA:
			udp_recv_data(ep, &hdr->data, n, sa);
			break;
		case OPCODE_CREQ:
			udp_recv_creq(ep, &hdr->creq, sa);
			break;
		case OPCODE_CACK:
			udp_recv_cack(ep, &hdr->cack, sa);
			break;
		case OPCODE_DISC:
			udp_recv_disc(ep, &hdr->disc, sa);
			break;
		case OPCODE_MESH: // TODO:
		                  // udp_recv_mesh(ep, &hdr->mesh, sa);
		                  // break;
		default:
			udp_send_disc_full(
			    ep, sa, 0, hdr->data.us_sender_id, 0, DISC_PROTO);
			break;
		}
	}

finish:
	// start another receive
	udp_start_rx(ep);

	// grab the list of completions so we can finish them.
	complq = ep->complq;
	nni_aio_completions_init(&ep->complq);
	nni_mtx_unlock(&ep->mtx);

	// now run the completions -- synchronously
	nni_aio_completions_run(&complq);
}